

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node expr_operand(Parser *psr)

{
  int iVar1;
  Node NVar2;
  Parser *psr_local;
  anon_union_8_6_f630ca3c_for_Node_1 local_10;
  
  iVar1 = (psr->lxr).tk.type;
  if (iVar1 == 0x28) {
    NVar2 = expr_operand_subexpr(psr);
    local_10 = NVar2.field_1;
    psr_local._0_4_ = NVar2.type;
  }
  else if (iVar1 == 0x113) {
    NVar2 = expr_operand_fn(psr);
    local_10 = NVar2.field_1;
    psr_local._0_4_ = NVar2.type;
  }
  else if (iVar1 == 0x114) {
    NVar2 = expr_operand_name(psr);
    local_10 = NVar2.field_1;
    psr_local._0_4_ = NVar2.type;
  }
  else if (iVar1 == 0x115) {
    NVar2 = expr_operand_num(psr);
    local_10 = NVar2.field_1;
    psr_local._0_4_ = NVar2.type;
  }
  else {
    if (2 < iVar1 - 0x116U) {
      psr_trigger_err(psr,"expected expression");
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x4de,"Node expr_operand(Parser *)");
    }
    NVar2 = expr_operand_prim(psr);
    local_10 = NVar2.field_1;
    psr_local._0_4_ = NVar2.type;
  }
  NVar2._4_4_ = 0;
  NVar2.type = (NodeType)psr_local;
  NVar2.field_1 = local_10;
  return NVar2;
}

Assistant:

static Node expr_operand(Parser *psr) {
	switch (psr->lxr.tk.type) {
	case TK_NUM:   return expr_operand_num(psr);
	case TK_IDENT: return expr_operand_name(psr);
	case '(':      return expr_operand_subexpr(psr);
	case TK_FN:    return expr_operand_fn(psr);
	case TK_TRUE: case TK_FALSE: case TK_NIL: return expr_operand_prim(psr);
	default:
		// We always call `expr_operand` expecting there to actually be an
		// operand; since we didn't find one, trigger an error
		psr_trigger_err(psr, "expected expression");
		UNREACHABLE();
	}
}